

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExecProgramCommand.cxx
# Opt level: O2

bool __thiscall
cmExecProgramCommand::InitialPass
          (cmExecProgramCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  size_type sVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  pointer pbVar6;
  char *dir;
  long lVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX_01;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX_02;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX_03;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX_04;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *path;
  pointer pbVar8;
  string *this_00;
  long lVar9;
  cmCommand *pcVar10;
  ulong uVar11;
  bool bVar12;
  int local_14c;
  int retVal;
  cmCommand *local_140;
  string command;
  string output_variable;
  string arguments;
  string return_variable;
  string coutput;
  string output;
  
  pbVar8 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar6 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar6 == pbVar8) {
    std::__cxx11::string::string
              ((string *)&coutput,"called with incorrect number of arguments",
               (allocator *)&arguments);
    cmCommand::SetError(&this->super_cmCommand,&coutput);
    std::__cxx11::string::~string((string *)&coutput);
    bVar12 = false;
  }
  else {
    arguments._M_dataplus._M_p = (pointer)&arguments.field_2;
    arguments._M_string_length = 0;
    lVar9 = 0;
    path = &output_variable.field_2;
    output_variable._M_string_length = 0;
    arguments.field_2._M_local_buf[0] = '\0';
    output_variable.field_2._M_local_buf[0] = '\0';
    return_variable._M_dataplus._M_p = (pointer)&return_variable.field_2;
    return_variable._M_string_length = 0;
    return_variable.field_2._M_local_buf[0] = '\0';
    bVar4 = false;
    local_14c = 0;
    bVar5 = false;
    uVar11 = 0;
    local_140 = &this->super_cmCommand;
    output_variable._M_dataplus._M_p = (pointer)path;
    bVar3 = false;
    while (bVar12 = (ulong)((long)pbVar6 - (long)pbVar8 >> 5) <= uVar11, !bVar12) {
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((long)&(pbVar8->_M_dataplus)._M_p + lVar9),"OUTPUT_VARIABLE");
      if (bVar2) {
        local_14c = local_14c + 1;
        path = extraout_RDX;
LAB_00351d57:
        bVar4 = false;
LAB_00351d5f:
        bVar5 = false;
      }
      else if (bVar3 == false) {
        bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )((long)&(((args->
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)
                                         ._M_p + lVar9),"RETURN_VALUE");
        if (!bVar3) {
          if (bVar5) {
            if (return_variable._M_string_length != 0) {
              std::__cxx11::string::string
                        ((string *)&coutput,"called with incorrect number of arguments",
                         (allocator *)&command);
              cmCommand::SetError(local_140,&coutput);
              goto LAB_00352092;
            }
            std::__cxx11::string::_M_assign((string *)&return_variable);
            local_14c = local_14c + 1;
            path = extraout_RDX_02;
          }
          else {
            bVar12 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)((long)&(((args->
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)->
                                                _M_dataplus)._M_p + lVar9),"ARGS");
            path = extraout_RDX_03;
            if (!bVar12) {
              if (!bVar4) goto LAB_00351d57;
              std::__cxx11::string::append((string *)&arguments);
              std::__cxx11::string::append((char *)&arguments);
              path = extraout_RDX_04;
            }
            local_14c = local_14c + 1;
            bVar4 = true;
          }
          goto LAB_00351d5f;
        }
        local_14c = local_14c + 1;
        bVar5 = true;
        bVar4 = false;
        path = extraout_RDX_01;
      }
      else {
        if (output_variable._M_string_length != 0) {
          std::__cxx11::string::string
                    ((string *)&coutput,"called with incorrect number of arguments",
                     (allocator *)&command);
          cmCommand::SetError(local_140,&coutput);
LAB_00352092:
          this_00 = &coutput;
          goto LAB_0035209a;
        }
        std::__cxx11::string::_M_assign((string *)&output_variable);
        local_14c = local_14c + 1;
        path = extraout_RDX_00;
      }
      uVar11 = uVar11 + 1;
      pbVar8 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      lVar9 = lVar9 + 0x20;
      bVar3 = bVar2;
      pbVar6 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
    }
    command._M_dataplus._M_p = (pointer)&command.field_2;
    command._M_string_length = 0;
    command.field_2._M_local_buf[0] = '\0';
    if (arguments._M_string_length == 0) {
      std::__cxx11::string::_M_assign((string *)&command);
      pcVar10 = local_140;
    }
    else {
      cmSystemTools::ConvertToRunCommandPath_abi_cxx11_
                (&coutput,(cmSystemTools *)(pbVar8->_M_dataplus)._M_p,path->_M_local_buf);
      pcVar10 = local_140;
      std::__cxx11::string::operator=((string *)&command,(string *)&coutput);
      std::__cxx11::string::~string((string *)&coutput);
      std::__cxx11::string::append((char *)&command);
      std::__cxx11::string::append((string *)&command);
    }
    sVar1 = output_variable._M_string_length;
    retVal = 0;
    output._M_dataplus._M_p = (pointer)&output.field_2;
    output._M_string_length = 0;
    output.field_2._M_local_buf[0] = '\0';
    pbVar8 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if (((long)(args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8 >> 5) - (long)local_14c ==
        2) {
      cmsys::SystemTools::MakeDirectory(pbVar8[1]._M_dataplus._M_p);
      dir = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p;
    }
    else {
      dir = (char *)0x0;
    }
    bVar5 = RunCommand(command._M_dataplus._M_p,&output,&retVal,dir,sVar1 == 0);
    if (!bVar5) {
      retVal = -1;
    }
    if (output_variable._M_string_length != 0) {
      uVar11 = std::__cxx11::string::find_first_not_of((char *)&output,0x4b1f74);
      lVar9 = std::__cxx11::string::find_last_not_of((char *)&output,0x4b1f74);
      if (uVar11 == 0xffffffffffffffff) {
        uVar11 = 0;
      }
      lVar7 = output._M_string_length - 1;
      if (lVar9 != -1) {
        lVar7 = lVar9;
      }
      std::__cxx11::string::string((string *)&coutput,(string *)&output,uVar11,(lVar7 - uVar11) + 1)
      ;
      cmMakefile::AddDefinition(pcVar10->Makefile,&output_variable,coutput._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&coutput);
    }
    if (return_variable._M_string_length != 0) {
      sprintf((char *)&coutput,"%d",(ulong)(uint)retVal);
      cmMakefile::AddDefinition(pcVar10->Makefile,&return_variable,(char *)&coutput);
    }
    std::__cxx11::string::~string((string *)&output);
    this_00 = &command;
LAB_0035209a:
    std::__cxx11::string::~string((string *)this_00);
    std::__cxx11::string::~string((string *)&return_variable);
    std::__cxx11::string::~string((string *)&output_variable);
    std::__cxx11::string::~string((string *)&arguments);
  }
  return bVar12;
}

Assistant:

bool cmExecProgramCommand
::InitialPass(std::vector<std::string> const& args, cmExecutionStatus &)
{
  if(args.size() < 1 )
    {
    this->SetError("called with incorrect number of arguments");
    return false;
    }
  std::string arguments;
  bool doingargs = false;
  int count = 0;
  std::string output_variable;
  bool haveoutput_variable = false;
  std::string return_variable;
  bool havereturn_variable = false;
  for(size_t i=0; i < args.size(); ++i)
    {
    if(args[i] == "OUTPUT_VARIABLE")
      {
      count++;
      doingargs = false;
      havereturn_variable = false;
      haveoutput_variable = true;
      }
    else if ( haveoutput_variable )
      {
      if (!output_variable.empty())
        {
        this->SetError("called with incorrect number of arguments");
        return false;
        }
      output_variable = args[i];
      haveoutput_variable = false;
      count ++;
      }
    else if(args[i] == "RETURN_VALUE")
      {
      count++;
      doingargs = false;
      haveoutput_variable = false;
      havereturn_variable = true;
      }
    else if ( havereturn_variable )
      {
      if (!return_variable.empty())
        {
        this->SetError("called with incorrect number of arguments");
        return false;
        }
      return_variable = args[i];
      havereturn_variable = false;
      count ++;
      }
    else if(args[i] == "ARGS")
      {
      count++;
      havereturn_variable = false;
      haveoutput_variable = false;
      doingargs = true;
      }
    else if(doingargs)
      {
      arguments += args[i];
      arguments += " ";
      count++;
      }
    }

  std::string command;
  if(!arguments.empty())
    {
    command = cmSystemTools::ConvertToRunCommandPath(args[0].c_str());
    command += " ";
    command += arguments;
    }
  else
    {
    command = args[0];
    }
  bool verbose = true;
  if(!output_variable.empty())
    {
    verbose = false;
    }
  int retVal = 0;
  std::string output;
  bool result = true;
  if(args.size() - count == 2)
    {
    cmSystemTools::MakeDirectory(args[1].c_str());
    result = cmExecProgramCommand::RunCommand(command.c_str(), output, retVal,
                                              args[1].c_str(), verbose);
    }
  else
    {
    result = cmExecProgramCommand::RunCommand(command.c_str(), output,
                                              retVal, 0, verbose);
    }
  if(!result)
    {
    retVal = -1;
    }

  if (!output_variable.empty())
    {
    std::string::size_type first = output.find_first_not_of(" \n\t\r");
    std::string::size_type last = output.find_last_not_of(" \n\t\r");
    if(first == std::string::npos)
      {
      first = 0;
      }
    if(last == std::string::npos)
      {
      last = output.size()-1;
      }

    std::string coutput = std::string(output, first, last-first+1);
    this->Makefile->AddDefinition(output_variable, coutput.c_str());
    }

  if (!return_variable.empty())
    {
    char buffer[100];
    sprintf(buffer, "%d", retVal);
    this->Makefile->AddDefinition(return_variable, buffer);
    }

  return true;
}